

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls,int extDict)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  ulong *puVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  ulong *puVar13;
  int iVar14;
  U32 UVar15;
  ulong uVar16;
  ulong uVar17;
  BYTE *pBVar18;
  ulong *puVar19;
  U32 *pUVar20;
  bool bVar21;
  U32 dummy32;
  BYTE *pInLoopLimit;
  int local_cc;
  uint *local_c0;
  uint *local_b8;
  ulong local_b0;
  ulong local_a8;
  uint local_9c;
  ulong local_98;
  BYTE *local_90;
  ulong *local_88;
  ulong local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  U32 *local_60;
  ulong *local_58;
  ulong *local_50;
  BYTE *local_48;
  ulong local_40;
  ulong local_38;
  
  cVar7 = (char)(ms->cParams).hashLog;
  switch(mls) {
  case 5:
    lVar3 = -0x30e4432345000000;
    break;
  case 6:
    lVar3 = -0x30e4432340650000;
    break;
  case 7:
    lVar3 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar3 = -0x30e44323485a9b9d;
    break;
  default:
    uVar16 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar7 & 0x1fU));
    goto LAB_0013723c;
  }
  uVar16 = (ulong)(lVar3 * *(long *)ip) >> (-cVar7 & 0x3fU);
LAB_0013723c:
  pUVar20 = ms->chainTable;
  uVar11 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  local_38 = (ulong)ms->hashTable[uVar16];
  local_90 = (ms->window).base;
  local_68 = (ms->window).dictBase;
  local_98 = (ulong)(ms->window).dictLimit;
  local_70 = local_68 + local_98;
  local_78 = local_90 + local_98;
  uVar12 = (int)ip - (int)local_90;
  local_80 = (ulong)uVar12;
  uVar8 = uVar12 - uVar11;
  local_a8 = 0;
  if (uVar12 < uVar11) {
    uVar8 = 0;
  }
  uVar1 = (ms->window).lowLimit;
  uVar2 = (ms->cParams).searchLog;
  ms->hashTable[uVar16] = uVar12;
  uVar16 = (ulong)((uVar12 & uVar11) * 2);
  local_b8 = pUVar20 + uVar16;
  iVar14 = 1 << ((byte)uVar2 & 0x1f);
  local_c0 = pUVar20 + uVar16 + 1;
  local_cc = uVar12 + 9;
  local_88 = (ulong *)(iend + -7);
  local_50 = (ulong *)(iend + -3);
  local_58 = (ulong *)(iend + -1);
  uVar16 = 8;
  local_b0 = 0;
  local_60 = pUVar20;
  do {
    bVar21 = iVar14 == 0;
    iVar14 = iVar14 + -1;
    if ((bVar21) || ((uint)local_38 < uVar1)) break;
    uVar5 = local_a8;
    if (local_b0 < local_a8) {
      uVar5 = local_b0;
    }
    uVar17 = local_38 & 0xffffffff;
    local_40 = uVar16;
    if ((extDict == 0) || (local_98 <= uVar17 + uVar5)) {
      puVar9 = (ulong *)(ip + uVar5);
      puVar19 = (ulong *)(local_90 + uVar17 + uVar5);
      puVar13 = puVar9;
      if (puVar9 < local_88) {
        uVar6 = *puVar9 ^ *puVar19;
        uVar16 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        uVar16 = uVar16 >> 3 & 0x1fffffff;
        if (*puVar19 == *puVar9) {
          do {
            puVar13 = puVar13 + 1;
            puVar19 = puVar19 + 1;
            if (local_88 <= puVar13) goto LAB_0013743f;
            uVar6 = *puVar13 ^ *puVar19;
            uVar16 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            uVar16 = (long)puVar13 + ((uVar16 >> 3 & 0x1fffffff) - (long)puVar9);
          } while (*puVar19 == *puVar13);
        }
      }
      else {
LAB_0013743f:
        if ((puVar13 < local_50) && ((int)*puVar19 == (int)*puVar13)) {
          puVar13 = (ulong *)((long)puVar13 + 4);
          puVar19 = (ulong *)((long)puVar19 + 4);
        }
        if ((puVar13 < local_58) && ((short)*puVar19 == (short)*puVar13)) {
          puVar13 = (ulong *)((long)puVar13 + 2);
          puVar19 = (ulong *)((long)puVar19 + 2);
        }
        if (puVar13 < iend) {
          puVar13 = (ulong *)((long)puVar13 + (ulong)((char)*puVar19 == (char)*puVar13));
        }
        uVar16 = (long)puVar13 - (long)puVar9;
      }
      uVar5 = uVar16 + uVar5;
      pBVar18 = local_90 + uVar17;
    }
    else {
      local_48 = local_68 + uVar17;
      sVar4 = ZSTD_count_2segments(ip + uVar5,local_48 + uVar5,iend,local_70,local_78);
      uVar5 = sVar4 + uVar5;
      pBVar18 = local_90 + uVar17;
      pUVar20 = local_60;
      if (uVar5 + uVar17 < local_98) {
        pBVar18 = local_48;
      }
    }
    uVar12 = (uint)local_38;
    uVar16 = local_40;
    if ((local_40 < uVar5) && (uVar16 = uVar5, local_cc - uVar12 < uVar5)) {
      local_cc = uVar12 + (int)uVar5;
    }
    if (ip + uVar5 == iend) {
      bVar21 = false;
    }
    else {
      puVar10 = pUVar20 + (uVar12 & uVar11) * 2;
      if (pBVar18[uVar5] < ip[uVar5]) {
        *local_b8 = uVar12;
        local_b0 = uVar5;
        if (uVar8 < uVar12) {
          puVar10 = puVar10 + 1;
          local_b8 = puVar10;
LAB_00137523:
          local_38 = (ulong)*puVar10;
          bVar21 = true;
        }
        else {
          bVar21 = false;
          local_b8 = &local_9c;
        }
      }
      else {
        *local_c0 = uVar12;
        local_c0 = puVar10;
        local_a8 = uVar5;
        if (uVar8 < uVar12) goto LAB_00137523;
        bVar21 = false;
        local_c0 = &local_9c;
      }
    }
  } while (bVar21);
  *local_c0 = 0;
  *local_b8 = 0;
  if (uVar16 < 0x181) {
    UVar15 = (local_cc - (int)local_80) - 8;
  }
  else {
    UVar15 = (int)uVar16 - 0x180;
    if (0xbf < UVar15) {
      UVar15 = 0xc0;
    }
  }
  return UVar15;
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 current = (U32)(ip-base);
    const U32 btLow = btMask >= current ? 0 : current - btMask;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = current+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((current-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((current-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", current);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = current;   /* Update Hash Table */

    assert(windowLow > 0);
    while (nbCompares-- && (matchIndex >= windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    if (bestLength > 384) return MIN(192, (U32)(bestLength - 384));   /* speed optimization */
    assert(matchEndIdx > current + 8);
    return matchEndIdx - (current + 8);
}